

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RoboteqInterface.cpp
# Opt level: O0

int handleroboteqinterface(RS232PORT *pRoboteqInterfacePseudoRS232Port)

{
  int iVar1;
  char *pcVar2;
  bool bVar3;
  char *tmp2;
  char *tmp;
  int iStack_828;
  char endchar;
  int spd;
  int chan;
  int maxrecvbuflen;
  int BytesReceived;
  int Bytes;
  char recvbuf [2048];
  RS232PORT *pRoboteqInterfacePseudoRS232Port_local;
  
  maxrecvbuflen = 0;
  chan = 0;
  spd = 0x800;
  iStack_828 = 0;
  tmp._4_4_ = 0;
  tmp._3_1_ = '\r';
  recvbuf._2040_8_ = pRoboteqInterfacePseudoRS232Port;
  iVar1 = CheckAvailBytesRS232Port(pRoboteqInterfacePseudoRS232Port,(int *)0x0);
  if (iVar1 == 0) {
    memset(&BytesReceived,0,0x800);
    while( true ) {
      bVar3 = true;
      if (0 < chan) {
        bVar3 = *(char *)((long)&BytesReceived + (long)(chan + -1)) != tmp._3_1_;
      }
      if (!bVar3) break;
      if (spd <= chan) {
        return 1;
      }
      iVar1 = ReadRS232Port((RS232PORT *)recvbuf._2040_8_,
                            (uint8 *)((long)&BytesReceived + (long)chan),1,&maxrecvbuflen);
      if (iVar1 != 0) {
        return 1;
      }
      if (maxrecvbuflen == 0) {
        return 1;
      }
      chan = maxrecvbuflen + chan;
    }
    EnterCriticalSection(&StateVariablesCS);
    for (tmp2 = strstr((char *)&BytesReceived,"?"); tmp2 != (char *)0x0; tmp2 = strstr(tmp2 + 1,"?")
        ) {
      iVar1 = strncmp(tmp2,"?FID",4);
      if (iVar1 == 0) {
        pcVar2 = strstr(tmp2,"\r");
        if (pcVar2 == (char *)0x0) {
          LeaveCriticalSection(&StateVariablesCS);
          return 1;
        }
        iVar1 = WriteAllRS232Port((RS232PORT *)recvbuf._2040_8_,(uint8 *)tmp2,
                                  ((int)pcVar2 - (int)tmp2) + 1);
        if (iVar1 != 0) {
          LeaveCriticalSection(&StateVariablesCS);
          return 1;
        }
        iVar1 = WriteAllRS232Port((RS232PORT *)recvbuf._2040_8_,
                                  (uint8 *)"FID=Roboteq v0.0 EMULATED 12/12/2023\r",0x25);
        if (iVar1 != 0) {
          LeaveCriticalSection(&StateVariablesCS);
          return 1;
        }
      }
      if (0x7fd < (long)&BytesReceived - (long)tmp2) break;
    }
    for (tmp2 = strstr((char *)&BytesReceived,"!"); tmp2 != (char *)0x0; tmp2 = strstr(tmp2 + 1,"!")
        ) {
      iVar1 = __isoc99_sscanf(tmp2,"!G %d %d",&stack0xfffffffffffff7d8,(long)&tmp + 4);
      if ((iVar1 == 2) ||
         (iVar1 = __isoc99_sscanf(tmp2,"!$00 %d %d",&stack0xfffffffffffff7d8,(long)&tmp + 4),
         iVar1 == 2)) {
        pcVar2 = strstr(tmp2,"\r");
        if (pcVar2 == (char *)0x0) {
          LeaveCriticalSection(&StateVariablesCS);
          return 1;
        }
        iVar1 = WriteAllRS232Port((RS232PORT *)recvbuf._2040_8_,(uint8 *)tmp2,
                                  ((int)pcVar2 - (int)tmp2) + 1);
        if (iVar1 != 0) {
          LeaveCriticalSection(&StateVariablesCS);
          return 1;
        }
        iVar1 = WriteAllRS232Port((RS232PORT *)recvbuf._2040_8_,(uint8 *)"+\r",2);
        if (iVar1 != 0) {
          LeaveCriticalSection(&StateVariablesCS);
          return 1;
        }
        if ((robid == 0x200) ||
           ((((robid != 0x1000 && (robid != 0x2000)) && (robid != 0x4000)) &&
            ((robid != 0x8000 &&
             (((robid == 0x10000 || (robid == 0x20000)) ||
              ((robid != 0x100000 && (robid != 0x200000)))))))))) {
          if (iStack_828 == 1) {
            roboteq_u1 = (double)tmp._4_4_ / 1000.0;
          }
          if (iStack_828 == 2) {
            roboteq_u2 = (double)tmp._4_4_ / 1000.0;
          }
          u = (roboteq_u1 + roboteq_u2) / 2.0;
          uw = (roboteq_u2 - roboteq_u1) / 2.0;
        }
        else {
          if (iStack_828 == 1) {
            roboteq_u1 = (double)tmp._4_4_ / 1000.0;
          }
          if (iStack_828 == 2) {
            roboteq_u2 = (double)tmp._4_4_ / 1000.0;
          }
          u = roboteq_u2;
          uw = roboteq_u1;
        }
      }
      if (0x7fd < (long)&BytesReceived - (long)tmp2) break;
    }
    LeaveCriticalSection(&StateVariablesCS);
  }
  else {
    uSleep(50000);
  }
  return 0;
}

Assistant:

int handleroboteqinterface(RS232PORT* pRoboteqInterfacePseudoRS232Port)
{
	char recvbuf[MAX_NB_BYTES_ROBOTEQ];
	int Bytes = 0, BytesReceived = 0, maxrecvbuflen = MAX_NB_BYTES_ROBOTEQ, chan = 0, spd = 0;
	char endchar = '\r';
	char* tmp = NULL;
	char* tmp2 = NULL;

	// Get data...
	if (CheckAvailBytesRS232Port(pRoboteqInterfacePseudoRS232Port, NULL) == EXIT_SUCCESS)
	{
		// Prepare the buffers.
		memset(recvbuf, 0, sizeof(recvbuf));

		// Receive byte per byte.
		while ((BytesReceived <= 0)||(recvbuf[BytesReceived-1] != endchar))
		{
			if (BytesReceived >= maxrecvbuflen)
			{
				return EXIT_FAILURE;
			}

			// Receive 1 byte.
			if (ReadRS232Port(pRoboteqInterfacePseudoRS232Port, (uint8*)(recvbuf + BytesReceived), 1, &Bytes) == EXIT_SUCCESS)
			{
				if (Bytes == 0)
				{
					return EXIT_FAILURE;
				}
			}
			else
			{
				return EXIT_FAILURE;
			}

			BytesReceived += Bytes;
		}

		// Analyze data.

		EnterCriticalSection(&StateVariablesCS);

		// To improve...

		tmp = strstr(recvbuf, "?");
		while (tmp)
		{
			if (strncmp(tmp, "?FID", strlen("?FID")) == 0)
			{
				tmp2 = strstr(tmp, "\r");
				if (!tmp2)
				{
					LeaveCriticalSection(&StateVariablesCS);
					return EXIT_FAILURE;
				}
				// Echo...
				if (WriteAllRS232Port(pRoboteqInterfacePseudoRS232Port, (uint8*)(tmp), tmp2-tmp+1) != EXIT_SUCCESS)
				{
					LeaveCriticalSection(&StateVariablesCS);
					return EXIT_FAILURE;
				}
				if (WriteAllRS232Port(pRoboteqInterfacePseudoRS232Port, (uint8*)("FID=Roboteq v0.0 EMULATED 12/12/2023\r"), strlen("FID=Roboteq v0.0 EMULATED 12/12/2023\r")) != EXIT_SUCCESS)
				{
					LeaveCriticalSection(&StateVariablesCS);
					return EXIT_FAILURE;
				}
			}
			if (recvbuf-tmp >= MAX_NB_BYTES_ROBOTEQ-2) break;
			tmp = strstr(tmp+1, "?");
		}

		tmp = strstr(recvbuf, "!");
		while (tmp)
		{
			if ((sscanf(tmp, "!G %d %d", &chan, &spd) == 2)||(sscanf(tmp, "!$00 %d %d", &chan, &spd) == 2))
			{
				tmp2 = strstr(tmp, "\r");
				if (!tmp2)
				{
					LeaveCriticalSection(&StateVariablesCS);
					return EXIT_FAILURE;
				}
				// Echo...
				if (WriteAllRS232Port(pRoboteqInterfacePseudoRS232Port, (uint8*)(tmp), tmp2-tmp+1) != EXIT_SUCCESS)
				{
					LeaveCriticalSection(&StateVariablesCS);
					return EXIT_FAILURE;
				}
				if (WriteAllRS232Port(pRoboteqInterfacePseudoRS232Port, (uint8*)("+\r"), strlen("+\r")) != EXIT_SUCCESS)
				{
					LeaveCriticalSection(&StateVariablesCS);
					return EXIT_FAILURE;
				}
	
				// Not thread-safe...

				switch (robid)
				{
				case BUGGY_SIMULATOR_ROBID:
				case BUGGY_ROBID:
				case SAILBOAT_SIMULATOR_ROBID:
				case VAIMOS_ROBID:
				case SAILBOAT_ROBID:
				case SAILBOAT2_ROBID:
					if (chan == 1) roboteq_u1 = spd/1000.0;
					if (chan == 2) roboteq_u2 = spd/1000.0;
					u = roboteq_u2;
					uw = roboteq_u1;
					break;
				case BUBBLE_ROBID:
				case ETAS_WHEEL_ROBID:
				case TANK_SIMULATOR_ROBID:
				default:
					if (chan == 1) roboteq_u1 = spd/1000.0;
					if (chan == 2) roboteq_u2 = spd/1000.0;
					u = (roboteq_u1+roboteq_u2)/2;
					uw = (roboteq_u2-roboteq_u1)/2;
					break;
				}

			}
			if (recvbuf-tmp >= MAX_NB_BYTES_ROBOTEQ-2) break;
			tmp = strstr(tmp+1, "!");
		}

		LeaveCriticalSection(&StateVariablesCS);
	}
	else 
	{
		uSleep(1000*50);
	}

	return EXIT_SUCCESS;
}